

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EVPathRemote.cpp
# Opt level: O1

void adios2::OpenSimpleResponseHandler
               (CManager cm,CMConnection conn,void *vevent,void *client_data,attr_list attrs)

{
  long lVar1;
  
  lVar1 = CMCondition_get_client_data(cm,*vevent);
  *(undefined8 *)(lVar1 + 0x98) = *(undefined8 *)((long)vevent + 8);
  *(undefined8 *)(lVar1 + 8) = *(undefined8 *)((long)vevent + 0x10);
  CMCondition_signal(cm,*vevent);
  return;
}

Assistant:

void OpenSimpleResponseHandler(CManager cm, CMConnection conn, void *vevent, void *client_data,
                               attr_list attrs)
{
    EVPathRemoteCommon::OpenSimpleResponseMsg open_response_msg =
        static_cast<EVPathRemoteCommon::OpenSimpleResponseMsg>(vevent);

    void *obj = CMCondition_get_client_data(cm, open_response_msg->OpenResponseCondition);
    static_cast<EVPathRemote *>(obj)->m_ID = open_response_msg->FileHandle;
    static_cast<EVPathRemote *>(obj)->m_Size = open_response_msg->FileSize;
    CMCondition_signal(cm, open_response_msg->OpenResponseCondition);
    return;
}